

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp fmt::v5::internal::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  double dVar2;
  fp fVar3;
  int dec_exp_step;
  int first_dec_exp;
  int index;
  double one_over_log2_10;
  int *pow10_exponent_local;
  undefined1 auStack_18 [4];
  int min_exponent_local;
  undefined4 local_10;
  
  dVar2 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  iVar1 = (int)dVar2 + 0x15b;
  if (iVar1 < 0) {
    iVar1 = (int)dVar2 + 0x162;
  }
  iVar1 = (iVar1 >> 3) + 1;
  *pow10_exponent = iVar1 * 8 + -0x15c;
  fp::fp((fp *)auStack_18,*(uint64_t *)(basic_data<void>::POW10_SIGNIFICANDS + (long)iVar1 * 8),
         (int)*(short *)(basic_data<void>::POW10_EXPONENTS + (long)iVar1 * 2));
  fVar3._12_4_ = 0;
  fVar3.f = _auStack_18;
  fVar3.e = local_10;
  return fVar3;
}

Assistant:

FMT_FUNC fp get_cached_power(int min_exponent, int &pow10_exponent) {
  const double one_over_log2_10 = 0.30102999566398114;  // 1 / log2(10)
  int index = static_cast<int>(std::ceil(
        (min_exponent + fp::significand_size - 1) * one_over_log2_10));
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  return fp(data::POW10_SIGNIFICANDS[index], data::POW10_EXPONENTS[index]);
}